

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O0

void sptk::world::interp1Q
               (double x,double shift,double *y,int x_length,double *xi,int xi_length,double *yi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  double *y_00;
  void *pvVar6;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  double *in_RDI;
  long in_R8;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  int i_1;
  int i;
  double delta_x;
  int *xi_base;
  double *delta_y;
  double *xi_fraction;
  int local_60;
  int local_5c;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ECX;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_ESI;
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  y_00 = (double *)operator_new__(uVar4);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)in_ECX;
  uVar4 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar4);
  for (local_5c = 0; local_5c < in_ECX; local_5c = local_5c + 1) {
    *(int *)((long)pvVar6 + (long)local_5c * 4) =
         (int)((*(double *)(in_RDX + (long)local_5c * 8) - in_XMM0_Qa) / in_XMM1_Qa);
    *(double *)((long)pvVar5 + (long)local_5c * 8) =
         (*(double *)(in_RDX + (long)local_5c * 8) - in_XMM0_Qa) / in_XMM1_Qa -
         (double)*(int *)((long)pvVar6 + (long)local_5c * 4);
  }
  diff(in_RDI,in_ESI,y_00);
  y_00[in_ESI + -1] = 0.0;
  for (local_60 = 0; local_60 < in_ECX; local_60 = local_60 + 1) {
    *(double *)(in_R8 + (long)local_60 * 8) =
         y_00[*(int *)((long)pvVar6 + (long)local_60 * 4)] *
         *(double *)((long)pvVar5 + (long)local_60 * 8) +
         in_RDI[*(int *)((long)pvVar6 + (long)local_60 * 4)];
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  if (y_00 != (double *)0x0) {
    operator_delete__(y_00);
  }
  return;
}

Assistant:

void interp1Q(double x, double shift, const double *y, int x_length,
    const double *xi, int xi_length, double *yi) {
  double *xi_fraction = new double[xi_length];
  double *delta_y = new double[x_length];
  int *xi_base = new int[xi_length];

  double delta_x = shift;
  for (int i = 0; i < xi_length; ++i) {
    xi_base[i] = static_cast<int>((xi[i] - x) / delta_x);
    xi_fraction[i] = (xi[i] - x) / delta_x - xi_base[i];
  }
  diff(y, x_length, delta_y);
  delta_y[x_length - 1] = 0.0;

  for (int i = 0; i < xi_length; ++i)
    yi[i] = y[xi_base[i]] + delta_y[xi_base[i]] * xi_fraction[i];

  // Bug was fixed at 2013/07/14 by M. Morise
  delete[] xi_fraction;
  delete[] xi_base;
  delete[] delta_y;
}